

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  string *this;
  int iVar1;
  bool bVar2;
  user_options *this_00;
  double __x;
  int exit_code;
  thread watch_th;
  thread copy_th;
  thread quit_th;
  shared_ptr<pstore::database> src_db;
  string src_path;
  status st;
  reference_wrapper<vacuum::user_options> local_b0 [2];
  not_null<const_char_*> local_a0;
  status *local_98;
  not_null<const_char_*> local_90;
  not_null<const_char_*> local_88;
  string src_dir;
  not_null<const_char_*> local_60;
  user_options user_opt;
  
  exit_code = 0;
  local_60.ptr_ = "main";
  pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_60);
  pstore::threads::set_name(local_60);
  std::__cxx11::string::string((string *)&src_path,"vacuumd",(allocator *)&user_opt);
  pstore::create_log_stream(&src_path);
  std::__cxx11::string::~string((string *)&src_path);
  this = &user_opt.src_path;
  user_opt.daemon_mode = false;
  user_opt.src_path._M_dataplus._M_p = (pointer)&user_opt.src_path.field_2;
  user_opt.src_path._M_string_length = 0;
  user_opt.src_path.field_2._M_local_buf[0] = '\0';
  get_switches((pair<vacuum::user_options,_int> *)&src_path,argc,argv);
  src_dir._M_dataplus._M_p = (pointer)&exit_code;
  src_dir._M_string_length = (size_type)&user_opt;
  std::tuple<vacuum::user_options&,int&>::operator=
            ((tuple<vacuum::user_options&,int&> *)&src_dir,
             (pair<vacuum::user_options,_int> *)&src_path);
  std::__cxx11::string::~string((string *)&src_path._M_string_length);
  iVar1 = exit_code;
  if (exit_code == 0) {
    std::__cxx11::string::string((string *)&src_path,(string *)this);
    pstore::path::posix::dir_name(&src_dir,&src_path);
    local_88.ptr_ = src_path._M_dataplus._M_p;
    pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_88);
    pstore::log<pstore::logger::quoted>(notice,"Start ",(quoted)local_88.ptr_);
    quit_th._M_id._M_thread._0_4_ = 1;
    copy_th._M_id._M_thread._0_1_ = 0;
    std::
    make_shared<pstore::database,std::__cxx11::string_const&,pstore::database::access_mode,bool>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&src_db,
               (access_mode *)&src_path,(bool *)&quit_th);
    st.modified._M_base._M_i = (__atomic_base<bool>)0x0;
    st.done._M_base._M_i = (__atomic_base<bool>)0x0;
    st.watch_running._M_base._M_i = (__atomic_base<bool>)false;
    create_quit_thread((status *)&quit_th,(shared_ptr<pstore::database> *)&st);
    this_00 = (user_options *)
              pstore::database::upgrade_to_write_lock
                        (src_db.super___shared_ptr<pstore::database,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
    if (this_00 == (user_options *)0x0) {
      pstore::assert_failed
                ("0",
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/tools/vacuum/main.cpp"
                 ,0x7c);
    }
    bVar2 = std::unique_lock<pstore::file::range_lock>::try_lock
                      ((unique_lock<pstore::file::range_lock> *)this_00);
    if (bVar2) {
      local_90.ptr_ = "Got the file lock. No-one has the file open.";
      pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_90);
      pstore::log((pstore *)0x6,__x);
      std::unique_lock<pstore::file::range_lock>::unlock
                ((unique_lock<pstore::file::range_lock> *)this_00);
    }
    watch_th._M_id._M_thread = (id)(id)&st;
    local_b0[0]._M_data = &user_opt;
    std::thread::
    thread<void(&)(std::shared_ptr<pstore::database>,vacuum::status*,vacuum::user_options_const&),std::shared_ptr<pstore::database>&,vacuum::status*,std::reference_wrapper<vacuum::user_options>,void>
              (&copy_th,vacuum::copy,&src_db,(status **)&watch_th,local_b0);
    local_b0[0]._M_data = this_00;
    local_98 = &st;
    std::thread::
    thread<void(&)(std::shared_ptr<pstore::database>,std::unique_lock<pstore::file::range_lock>&,vacuum::status*),std::shared_ptr<pstore::database>&,std::reference_wrapper<std::unique_lock<pstore::file::range_lock>>,vacuum::status*,void>
              (&watch_th,vacuum::watch,&src_db,
               (reference_wrapper<std::unique_lock<pstore::file::range_lock>_> *)local_b0,&local_98)
    ;
    std::__shared_ptr<pstore::database,_(__gnu_cxx::_Lock_policy)2>::reset
              (&src_db.super___shared_ptr<pstore::database,_(__gnu_cxx::_Lock_policy)2>);
    std::thread::join();
    std::thread::join();
    notify_quit_thread();
    std::thread::join();
    local_a0.ptr_ = src_path._M_dataplus._M_p;
    pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_a0);
    pstore::log<pstore::logger::quoted>(notice,"main () exiting: ",(quoted)local_a0.ptr_);
    std::thread::~thread(&watch_th);
    std::thread::~thread(&copy_th);
    std::thread::~thread(&quit_th);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&src_db.super___shared_ptr<pstore::database,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    std::__cxx11::string::~string((string *)&src_dir);
    std::__cxx11::string::~string((string *)&src_path);
    std::__cxx11::string::~string((string *)this);
  }
  else {
    std::__cxx11::string::~string((string *)this);
    exit_code = iVar1;
  }
  return exit_code;
}

Assistant:

int main (int argc, char * argv[]) {
#endif
    int exit_code = EXIT_SUCCESS;
    using priority = pstore::logger::priority;
    PSTORE_TRY {
        pstore::threads::set_name ("main");
        pstore::create_log_stream ("vacuumd");

        vacuum::user_options user_opt;
        std::tie (user_opt, exit_code) = get_switches (argc, argv);
        if (exit_code != EXIT_SUCCESS) {
            return exit_code;
        }

#if 0
        if (user_opt.daemon_mode) {
#    ifdef _WIN32
            if (::SetPriorityClass (::GetCurrentProcess (), PROCESS_MODE_BACKGROUND_BEGIN) == 0) {
                throw pstore::win32::exception ("SetPriorityClass", ::GetLastError ());
            }
#    else
            // Increase our "niceness" value to reduce the priority of the process.
            if (::setpriority (PRIO_PROCESS, 0, 7) == -1) {
                raise (pstore::errno_erc {errno}, "setpriority");
            }
            if (daemon (0 /*nochdir*/, 0 /*noclose*/) != 0) {
                raise (pstore::errno_erc {errno}, "daemon");
            }
#    endif
        }
#endif

        // bool const verbose = (options [verbose_opt] != nullptr);
        std::string const src_path = user_opt.src_path;
        std::string const src_dir = pstore::path::dir_name (src_path);

        log (priority::notice, "Start ", pstore::logger::quoted{src_path.c_str ()});

        // Superficially, we shouldn't need write access to the data store, but we do so because
        // once the collection is complete, we'll rename the temporary file that has been created
        // to the real file name that we're replacing. If the target file isn't writable, we
        // shouldn't try to replace it with the newer version.
        auto src_db = std::make_shared<pstore::database> (
            src_path, pstore::database::access_mode::writable, false /*access tick enabled*/);

        vacuum::status st;
        std::thread quit_th = create_quit_thread (st, src_db);

        std::unique_lock<pstore::file::range_lock> * file_lock = src_db->upgrade_to_write_lock ();
        if (file_lock == nullptr) {
            PSTORE_ASSERT (0);
        }

        if (file_lock->try_lock ()) {
            log (priority::info, "Got the file lock. No-one has the file open.");
            file_lock->unlock ();
        }

        std::thread copy_th (vacuum::copy, src_db, &st, std::ref (user_opt));
        std::thread watch_th (vacuum::watch, src_db, std::ref (*file_lock), &st);

        src_db.reset (); // main thread releases its reference to the source database.

        copy_th.join ();
        watch_th.join ();

        // We're done. Ask the quit thread to exit.
        notify_quit_thread ();
        quit_th.join ();

        // TODO:
        // On macOS we can do better than rename() [see man 2 exchangedata].
        // Similar elsewhere?

        log (priority::notice, "main () exiting: ", pstore::logger::quoted{src_path.c_str ()});
    }